

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void __thiscall
Encoder::SaveToLazyBailOutRecordList(Encoder *this,Instr *instr,uint32 currentOffset)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  BailOutInfo *pBVar3;
  undefined4 *puVar4;
  undefined1 local_40 [8];
  LazyBailOutRecord record;
  
  pBVar3 = IR::Instr::GetBailOutInfo(instr);
  bVar2 = IR::Instr::OnlyHasLazyBailOut(instr);
  if ((!bVar2) || (pBVar3->bailOutRecord == (BailOutRecord *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x67d,
                       "(instr->OnlyHasLazyBailOut() && bailOutInfo->bailOutRecord != nullptr)",
                       "instr->OnlyHasLazyBailOut() && bailOutInfo->bailOutRecord != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,LazyBailoutPhase,sourceContextId,functionId)
  ;
  if (bVar2) {
    Output::Print(L"Offset: %u Instr: ",(ulong)currentOffset);
    IR::Instr::Dump(instr);
    Output::Print(L"Bailout label: ");
    IR::Instr::Dump(pBVar3->bailOutInstr);
  }
  record._0_8_ = pBVar3->bailOutRecord;
  local_40._0_4_ = currentOffset;
  JsUtil::
  List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (this->m_sortedLazyBailoutRecordList,(LazyBailOutRecord *)local_40);
  return;
}

Assistant:

void
Encoder::SaveToLazyBailOutRecordList(IR::Instr* instr, uint32 currentOffset)
{
    BailOutInfo* bailOutInfo = instr->GetBailOutInfo();

    Assert(instr->OnlyHasLazyBailOut() && bailOutInfo->bailOutRecord != nullptr);

#if DBG_DUMP
    if (PHASE_DUMP(Js::LazyBailoutPhase, m_func))
    {
        Output::Print(_u("Offset: %u Instr: "), currentOffset);
        instr->Dump();
        Output::Print(_u("Bailout label: "));
        bailOutInfo->bailOutInstr->Dump();
    }
#endif

    LazyBailOutRecord record(currentOffset, bailOutInfo->bailOutRecord);
    this->m_sortedLazyBailoutRecordList->Add(record);
}